

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata_test.cc
# Opt level: O0

void libaom_examples::anon_unknown_0::TestConversion(double v)

{
  undefined1 uVar1;
  bool bVar2;
  AssertHelper *this;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  DepthRepresentationElement e;
  double in_stack_00000120;
  double in_stack_00000128;
  double in_stack_00000130;
  char *in_stack_00000138;
  char *in_stack_00000140;
  char *in_stack_00000148;
  double *in_stack_ffffffffffffff58;
  AssertionResult *in_stack_ffffffffffffff60;
  DepthRepresentationElement *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  DepthRepresentationElement *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  Type in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar3;
  string local_68 [40];
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  AssertHelper *in_stack_ffffffffffffffe0;
  
  uVar1 = double_to_depth_representation_element
                    ((double)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     in_stack_ffffffffffffff80);
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_ffffffffffffff60,(bool *)in_stack_ffffffffffffff58,(type *)0xdceb38);
  bVar2 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffe0);
  if (!bVar2) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    in_stack_ffffffffffffff68 =
         (DepthRepresentationElement *)
         testing::Message::operator<<
                   ((Message *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),
               in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff8c,&in_stack_ffffffffffffff80->sign_flag,
               in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffffe0,(Message *)CONCAT17(uVar1,in_stack_ffffffffffffffd8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff60);
    std::__cxx11::string::~string(local_68);
    testing::Message::~Message((Message *)0xdcebf7);
  }
  uVar3 = (uint)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdcec77);
  if (uVar3 == 0) {
    depth_representation_element_to_double(in_stack_ffffffffffffff68);
    testing::internal::DoubleNearPredFormat
              (in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130,
               in_stack_00000128,in_stack_00000120);
    bVar2 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff80);
    if (!bVar2) {
      testing::Message::Message((Message *)CONCAT44(uVar3,in_stack_ffffffffffffff90));
      this = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xdced00);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(uVar3,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c
                 ,&in_stack_ffffffffffffff80->sign_flag,in_stack_ffffffffffffff7c,
                 in_stack_ffffffffffffff70);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffe0,(Message *)CONCAT17(uVar1,in_stack_ffffffffffffffd8));
      testing::internal::AssertHelper::~AssertHelper(this);
      testing::Message::~Message((Message *)0xdced4e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xdced9e);
  }
  return;
}

Assistant:

void TestConversion(double v) {
  DepthRepresentationElement e;
  ASSERT_TRUE(double_to_depth_representation_element(v, &e)) << v;
  EXPECT_NEAR(depth_representation_element_to_double(e), v, 0.000000001);
}